

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool anon_unknown.dwarf_1df8047::processSources
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *srcs,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *uniqueSrcs,bool debugSources)

{
  cmListFileBacktrace *__args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalGenerator *this;
  pointer pbVar3;
  byte bVar4;
  bool bVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmake *pcVar7;
  ostream *poVar8;
  long *plVar9;
  string *psVar10;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar11;
  size_t *psVar12;
  ulong *puVar13;
  long lVar14;
  char *pcVar15;
  undefined3 in_register_00000081;
  pointer pEVar16;
  pointer __args;
  __hashtable *__h;
  bool bVar17;
  bool bVar18;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar19;
  string e;
  string fullPath;
  string w;
  string usedSources;
  byte local_26e;
  undefined1 local_268 [32];
  cmGeneratorTarget *local_248;
  size_t *local_240;
  long local_238;
  size_t local_230;
  long lStack_228;
  string local_220;
  pointer local_200;
  string *local_1f8;
  string local_1f0;
  undefined4 local_1cc;
  pointer local_1c8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1c0;
  cmMakefile *local_1b8;
  string *local_1b0;
  cmTarget *local_1a8;
  cmMakefile *local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  
  local_1cc = CONCAT31(in_register_00000081,debugSources);
  local_248 = tgt;
  local_1c0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs;
  local_1b8 = cmTarget::GetMakefile(tgt->Target);
  bVar4 = entries->HadContextSensitiveCondition;
  pEVar16 = (entries->Entries).
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (entries->Entries).
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar17 = pEVar16 == local_1c8;
  if (!bVar17) {
    paVar1 = &local_220.field_2;
    do {
      if (pEVar16->ContextDependent != false) {
        bVar4 = 1;
      }
      local_1f8 = cmLinkItem::AsStr_abi_cxx11_(&pEVar16->LinkImplItem->super_cmLinkItem);
      psVar10 = (pEVar16->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b0 = (pEVar16->Values).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar18 = psVar10 == local_1b0;
      local_200 = pEVar16;
      while (!bVar18) {
        this_00 = cmMakefile::GetOrCreateSource(local_1b8,psVar10,false,Ambiguous);
        local_268._0_8_ = local_268 + 0x10;
        local_268._8_8_ = 0;
        local_268._16_8_ = local_268._16_8_ & 0xffffffffffffff00;
        local_220._M_string_length = 0;
        local_220.field_2._M_allocated_capacity =
             local_220.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_220._M_dataplus._M_p = (pointer)paVar1;
        psVar6 = cmSourceFile::ResolveFullPath(this_00,(string *)local_268,&local_220);
        local_240 = &local_230;
        pcVar2 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar2,pcVar2 + psVar6->_M_string_length);
        pcVar7 = cmLocalGenerator::GetCMakeInstance(local_248->LocalGenerator);
        if (local_220._M_string_length != 0) {
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xfffffffffffffe58);
          cmake::IssueMessage(pcVar7,AUTHOR_WARNING,&local_220,
                              (cmListFileBacktrace *)&stack0xfffffffffffffe58);
          if (local_1a0 != (cmMakefile *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
          }
        }
        if (local_238 == 0) {
          if (local_268._8_8_ != 0) {
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xfffffffffffffe58);
            cmake::IssueMessage(pcVar7,FATAL_ERROR,(string *)local_268,
                                (cmListFileBacktrace *)&stack0xfffffffffffffe58);
            if (local_1a0 != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
            }
          }
LAB_004a5a94:
          bVar5 = false;
          local_26e = bVar4;
        }
        else {
          if ((local_1f8->_M_string_length != 0) &&
             (bVar5 = cmsys::SystemTools::FileIsFullPath(psVar10), !bVar5)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe58);
            if (local_1f8->_M_string_length == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&stack0xfffffffffffffe58,
                         "Found relative path while evaluating sources of \"",0x31);
              psVar6 = cmTarget::GetName_abi_cxx11_(local_248->Target);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&stack0xfffffffffffffe58,(psVar6->_M_dataplus)._M_p,
                                  psVar6->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\":\n  \"",6);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
              lVar14 = 2;
              pcVar15 = "\"\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&stack0xfffffffffffffe58,"Target \"",8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&stack0xfffffffffffffe58,(local_1f8->_M_dataplus)._M_p,
                                  local_1f8->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
              lVar14 = 1;
              pcVar15 = "\"";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar15,lVar14);
            this = local_248->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe58);
            std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
            goto LAB_004a5a94;
          }
          bVar5 = true;
          std::__cxx11::string::_M_assign((string *)psVar10);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_268._0_8_ !=
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_268 + 0x10)) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
        if (!bVar5) break;
        psVar10 = psVar10 + 1;
        bVar18 = psVar10 == local_1b0;
      }
      if (!bVar18) break;
      local_1a8 = (cmTarget *)&stack0xfffffffffffffe68;
      local_1a0 = (cmMakefile *)0x0;
      local_198 = 0;
      __args = (local_200->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (local_200->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__args != pbVar3) {
        __args_1 = &local_200->Backtrace;
        do {
          local_268._0_8_ = uniqueSrcs;
          pVar19 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)uniqueSrcs,__args,local_268);
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                      (local_1c0,__args,__args_1);
            if ((char)local_1cc != '\0') {
              std::operator+(&local_220," * ",__args);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_220);
              local_268._0_8_ = local_268 + 0x10;
              puVar11 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(plVar9 + 2);
              if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*plVar9 == puVar11) {
                local_268._16_8_ = (puVar11->_M_h)._M_buckets;
                local_268._24_8_ = plVar9[3];
              }
              else {
                local_268._16_8_ = (puVar11->_M_h)._M_buckets;
                local_268._0_8_ =
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)*plVar9;
              }
              local_268._8_8_ = plVar9[1];
              *plVar9 = (long)puVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&stack0xfffffffffffffe58,local_268._0_8_);
              if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268._0_8_ !=
                  (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_268 + 0x10)) {
                operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != paVar1) {
                operator_delete(local_220._M_dataplus._M_p,
                                local_220.field_2._M_allocated_capacity + 1);
              }
            }
          }
          __args = __args + 1;
        } while (__args != pbVar3);
      }
      pEVar16 = local_200;
      if (local_1a0 != (cmMakefile *)0x0) {
        pcVar7 = cmLocalGenerator::GetCMakeInstance(local_248->LocalGenerator);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f0,"Used sources for target ","");
        psVar10 = cmTarget::GetName_abi_cxx11_(local_248->Target);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_1f0,(ulong)(psVar10->_M_dataplus)._M_p);
        psVar12 = (size_t *)(plVar9 + 2);
        if ((size_t *)*plVar9 == psVar12) {
          local_230 = *psVar12;
          lStack_228 = plVar9[3];
          local_240 = &local_230;
        }
        else {
          local_230 = *psVar12;
          local_240 = (size_t *)*plVar9;
        }
        local_238 = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_240);
        puVar13 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_220.field_2._M_allocated_capacity = *puVar13;
          local_220.field_2._8_8_ = plVar9[3];
          local_220._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_220.field_2._M_allocated_capacity = *puVar13;
          local_220._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_220._M_string_length = plVar9[1];
        *plVar9 = (long)puVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_1a8);
        local_268._0_8_ = local_268 + 0x10;
        puVar11 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(plVar9 + 2);
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)*plVar9 == puVar11) {
          local_268._16_8_ = (puVar11->_M_h)._M_buckets;
          local_268._24_8_ = plVar9[3];
        }
        else {
          local_268._16_8_ = (puVar11->_M_h)._M_buckets;
          local_268._0_8_ =
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)*plVar9;
        }
        local_268._8_8_ = plVar9[1];
        *plVar9 = (long)puVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        cmake::IssueMessage(pcVar7,LOG,(string *)local_268,&pEVar16->Backtrace);
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_268._0_8_ !=
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_268 + 0x10)) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar1) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,local_230 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1a8 != (cmTarget *)&stack0xfffffffffffffe68) {
        operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
      }
      pEVar16 = pEVar16 + 1;
      bVar17 = pEVar16 == local_1c8;
    } while (!bVar17);
  }
  if (bVar17) {
    local_26e = bVar4;
  }
  return (bool)(local_26e & 1);
}

Assistant:

bool processSources(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries& entries,
                    std::vector<BT<std::string>>& srcs,
                    std::unordered_set<std::string>& uniqueSrcs,
                    bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = entries.HadContextSensitiveCondition;

  for (EvaluatedTargetPropertyEntry& entry : entries.Entries) {
    if (entry.ContextDependent) {
      contextDependent = true;
    }

    cmLinkImplItem const& item = entry.LinkImplItem;
    std::string const& targetName = item.AsStr();

    for (std::string& src : entry.Values) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string w;
      std::string fullPath = sf->ResolveFullPath(&e, &w);
      cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, tgt->GetBacktrace());
      }
      if (fullPath.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entry.Values) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry.Backtrace);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry.Backtrace);
    }
  }
  return contextDependent;
}